

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-summon.c
# Opt level: O2

errr finish_parse_summon(parser *p)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  summon *psVar9;
  wchar_t wVar10;
  undefined8 *puVar11;
  long lVar12;
  long lVar13;
  wchar_t *pwVar14;
  
  summon_max = L'\0';
  puVar11 = (undefined8 *)parser_priv(p);
  for (; puVar11 != (undefined8 *)0x0; puVar11 = (undefined8 *)*puVar11) {
    summon_max = summon_max + L'\x01';
  }
  summons = (summon *)mem_zalloc((long)(summon_max + L'\x01') << 6);
  lVar12 = (long)summon_max;
  puVar11 = (undefined8 *)parser_priv(p);
  lVar12 = lVar12 << 6;
  while (psVar9 = summons, puVar11 != (undefined8 *)0x0) {
    uVar2 = *puVar11;
    uVar3 = puVar11[1];
    uVar4 = puVar11[2];
    uVar5 = puVar11[3];
    uVar6 = puVar11[4];
    uVar7 = puVar11[5];
    uVar8 = puVar11[7];
    puVar1 = (undefined8 *)((long)&summons[-1].fallback + lVar12);
    *puVar1 = puVar11[6];
    puVar1[1] = uVar8;
    puVar1 = (undefined8 *)((long)&psVar9[-1].race_flag + lVar12);
    *puVar1 = uVar6;
    puVar1[1] = uVar7;
    puVar1 = (undefined8 *)((long)&psVar9[-1].message_type + lVar12);
    *puVar1 = uVar4;
    puVar1[1] = uVar5;
    puVar1 = (undefined8 *)((long)&psVar9[-1].next + lVar12);
    *puVar1 = uVar2;
    puVar1[1] = uVar3;
    puVar1 = (undefined8 *)*puVar11;
    *(undefined8 *)((long)&psVar9[-1].next + lVar12) = 0;
    mem_free(puVar11);
    puVar11 = puVar1;
    lVar12 = lVar12 + -0x40;
  }
  lVar13 = (long)summon_max;
  summon_max = summon_max + L'\x01';
  pwVar14 = &summons->fallback;
  for (lVar12 = 0; lVar12 <= lVar13; lVar12 = lVar12 + 1) {
    wVar10 = summon_name_to_idx(*(char **)(pwVar14 + -2));
    *pwVar14 = wVar10;
    pwVar14 = pwVar14 + 0x10;
  }
  parser_destroy(p);
  return 0;
}

Assistant:

static errr finish_parse_summon(struct parser *p) {
	struct summon *summon, *next;
	int index;

	/* Count the entries */
	summon_max = 0;
	summon = parser_priv(p);
	while (summon) {
		summon_max++;
		summon = summon->next;
	}

	/* Allocate the direct access list and copy the data to it */
	summons = mem_zalloc((summon_max + 1) * sizeof(*summon));
	index = summon_max - 1;
	for (summon = parser_priv(p); summon; summon = next, index--) {
		memcpy(&summons[index], summon, sizeof(*summon));
		next = summon->next;
		summons[index].next = NULL;

		mem_free(summon);
	}
	summon_max += 1;

	/* Add indices of fallback summons */
	for (index = 0; index < summon_max; index++) {
		char *name = summons[index].fallback_name;
		summons[index].fallback = summon_name_to_idx(name);
	}

	parser_destroy(p);
	return 0;
}